

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestService_Stub::Foo
          (TestService_Stub *this,RpcController *controller,FooRequest *request,
          FooResponse *response,Closure *done)

{
  RpcChannel *pRVar1;
  
  pRVar1 = this->channel_;
  google::protobuf::internal::AssignDescriptors
            (&descriptor_table_google_2fprotobuf_2funittest_2eproto);
  if (0 < file_level_service_descriptors_google_2fprotobuf_2funittest_2eproto[0]->method_count_) {
    (*pRVar1->_vptr_RpcChannel[2])
              (pRVar1,file_level_service_descriptors_google_2fprotobuf_2funittest_2eproto[0]->
                      methods_,controller,request,response,done);
    return;
  }
  Foo();
}

Assistant:

void TestService_Stub::Foo(
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::proto2_unittest::FooRequest* PROTOBUF_NONNULL request, ::proto2_unittest::FooResponse* PROTOBUF_NONNULL response,
    ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  channel_->CallMethod(descriptor()->method(0), controller,
                       request, response, done);
}